

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

int __thiscall AggressiveBotStrategy::attackToCountryIndex(AggressiveBotStrategy *this)

{
  int iVar1;
  int iVar2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar3;
  size_type sVar4;
  reference ppCVar5;
  ulong local_28;
  unsigned_long i;
  value_type pCStack_18;
  uint index;
  Country *smallestNeighbour;
  AggressiveBotStrategy *this_local;
  
  pCStack_18 = (value_type)0x0;
  i._4_4_ = 0;
  local_28 = 0;
  while( true ) {
    pvVar3 = Map::Country::getAdjCountries((this->super_PlayerStrategy).from);
    sVar4 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar3);
    if (sVar4 <= local_28) break;
    if (pCStack_18 == (value_type)0x0) {
      pvVar3 = Map::Country::getAdjCountries((this->super_PlayerStrategy).from);
      ppCVar5 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at(pvVar3,local_28);
      iVar1 = Map::Country::getPlayerOwnerID(*ppCVar5);
      iVar2 = Map::Country::getPlayerOwnerID((this->super_PlayerStrategy).from);
      if (iVar1 != iVar2) {
        pvVar3 = Map::Country::getAdjCountries((this->super_PlayerStrategy).from);
        ppCVar5 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at(pvVar3,local_28);
        pCStack_18 = *ppCVar5;
        i._4_4_ = (int)local_28;
      }
    }
    if (pCStack_18 != (Country *)0x0) {
      iVar1 = Map::Country::getNumberOfTroops(pCStack_18);
      pvVar3 = Map::Country::getAdjCountries((this->super_PlayerStrategy).from);
      ppCVar5 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at(pvVar3,local_28);
      iVar2 = Map::Country::getNumberOfTroops(*ppCVar5);
      if (iVar2 < iVar1) {
        pvVar3 = Map::Country::getAdjCountries((this->super_PlayerStrategy).from);
        ppCVar5 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at(pvVar3,local_28);
        iVar1 = Map::Country::getPlayerOwnerID(*ppCVar5);
        iVar2 = Map::Country::getPlayerOwnerID((this->super_PlayerStrategy).from);
        if (iVar1 != iVar2) {
          pvVar3 = Map::Country::getAdjCountries((this->super_PlayerStrategy).from);
          ppCVar5 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                              (pvVar3,local_28);
          pCStack_18 = *ppCVar5;
          i._4_4_ = (int)local_28;
        }
      }
    }
    local_28 = local_28 + 1;
  }
  (this->super_PlayerStrategy).to = pCStack_18;
  return i._4_4_;
}

Assistant:

int AggressiveBotStrategy::attackToCountryIndex() {
    Map::Country* smallestNeighbour = nullptr;
    unsigned int index = 0;
    for (unsigned long i = 0; i < from->getAdjCountries()->size(); i++) {
        if (smallestNeighbour == nullptr && from->getAdjCountries()->at(i)->getPlayerOwnerID() != from->getPlayerOwnerID()) {
            smallestNeighbour = from->getAdjCountries()->at(i);
            index = i;
        }
        if (smallestNeighbour != nullptr && smallestNeighbour->getNumberOfTroops() > from->getAdjCountries()->at(i)->getNumberOfTroops() && from->getAdjCountries()->at(i)->getPlayerOwnerID()!= from->getPlayerOwnerID()) {
            smallestNeighbour = from->getAdjCountries()->at(i);
            index = i;
        }
    }

    to = smallestNeighbour;
    return (int) index;
}